

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O2

void dukglue_call_method<NativeObject*,int,int>
               (duk_context *ctx,NativeObject **obj,char *method_name,int args,int args_1)

{
  duk_bool_t dVar1;
  int args_local;
  
  dukglue_push<NativeObject*>(ctx,obj);
  duk_get_prop_string(ctx,-1,method_name);
  dVar1 = duk_check_type(ctx,-1,1);
  if (dVar1 != 0) {
    duk_error_raw(ctx,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/public_util.h"
                  ,0x44,"Method does not exist",method_name);
  }
  dVar1 = duk_is_function(ctx,-1);
  if (dVar1 != 0) {
    duk_swap_top(ctx,-2);
    dukglue_push<int,int>(ctx,&args_local,args_1);
    duk_call_method(ctx,2);
    return;
  }
  duk_error_raw(ctx,6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/public_util.h"
                ,0x49,"Property is not callable");
}

Assistant:

void dukglue_call_method(duk_context* ctx, const ObjT& obj, const char* method_name, ArgTs... args)
{
	dukglue_push(ctx, obj);
	duk_get_prop_string(ctx, -1, method_name);

	if (duk_check_type(ctx, -1, DUK_TYPE_UNDEFINED)) {
		duk_error(ctx, DUK_ERR_REFERENCE_ERROR, "Method does not exist", method_name);
		return;
	}

	if (!duk_is_callable(ctx, -1)) {
		duk_error(ctx, DUK_ERR_TYPE_ERROR, "Property is not callable");
		return;
	}

	duk_swap_top(ctx, -2);
	dukglue_push(ctx, args...);
	duk_call_method(ctx, sizeof...(args));
}